

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O0

int lib::io::Seek(State *state)

{
  bool bVar1;
  int iVar2;
  UserData *this;
  FILE *__stream;
  long lVar3;
  State *in_RDI;
  double dVar4;
  long pos;
  int res;
  long offset;
  string whence;
  int params;
  FILE *file;
  UserData *user_data;
  StackAPI api;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  ValueT in_stack_ffffffffffffff68;
  ValueT in_stack_ffffffffffffff6c;
  ValueT in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  StackAPI *in_stack_ffffffffffffff78;
  int local_70;
  long local_60;
  string local_58 [16];
  String *in_stack_ffffffffffffffb8;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  if (bVar1) {
    this = luna::StackAPI::GetUserData
                     ((StackAPI *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      in_stack_ffffffffffffff64);
    __stream = (FILE *)luna::UserData::GetData(this);
    iVar2 = luna::StackAPI::GetStackSize
                      ((StackAPI *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (1 < iVar2) {
      luna::StackAPI::GetString
                ((StackAPI *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff64);
      luna::String::GetStdString_abi_cxx11_(in_stack_ffffffffffffffb8);
      local_60 = 0;
      if (2 < iVar2) {
        dVar4 = luna::StackAPI::GetNumber
                          ((StackAPI *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                           ,in_stack_ffffffffffffff64);
        local_60 = (long)dVar4;
      }
      local_70 = 0;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
      ;
      if (bVar1) {
        local_70 = fseek(__stream,local_60,0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                ));
        if (bVar1) {
          local_70 = fseek(__stream,local_60,1);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  (char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff64 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff64);
          if (bVar1) {
            in_stack_ffffffffffffff60 = fseek(__stream,local_60,2);
            local_70 = in_stack_ffffffffffffff60;
          }
        }
      }
      if (local_70 != 0) {
        in_stack_ffffffffffffff5c =
             PushError((StackAPI *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_4 = in_stack_ffffffffffffff5c;
      }
      std::__cxx11::string::~string(local_58);
      if (local_70 != 0) {
        return local_4;
      }
    }
    lVar3 = ftell(__stream);
    if (lVar3 < 0) {
      local_4 = PushError((StackAPI *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
      ;
    }
    else {
      luna::StackAPI::PushNumber
                ((StackAPI *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Seek(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_UserData,
                           luna::ValueT_String, luna::ValueT_Number))
            return 0;

        auto user_data = api.GetUserData(0);
        auto file = reinterpret_cast<std::FILE *>(user_data->GetData());

        auto params = api.GetStackSize();
        if (params > 1)
        {
            auto whence = api.GetString(1)->GetStdString();
            long offset = 0;
            if (params > 2)
                offset = static_cast<long>(api.GetNumber(2));

            int res = 0;
            if (whence == "set")
                res = std::fseek(file, offset, SEEK_SET);
            else if (whence == "cur")
                res = std::fseek(file, offset, SEEK_CUR);
            else if (whence == "end")
                res = std::fseek(file, offset, SEEK_END);

            if (res != 0)
                return PushError(api);
        }

        auto pos = std::ftell(file);
        if (pos < 0)
            return PushError(api);

        api.PushNumber(pos);
        return 1;
    }